

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_3,_3> *
deqp::gles3::Functional::MatrixCaseUtils::inverse<3>
          (Matrix<float,_3,_3> *__return_storage_ptr__,Matrix<float,_3,_3> *mat)

{
  float scalar;
  Matrix<float,_1,_2> blockC;
  Matrix<float,_2,_1> matB;
  Matrix<float,_1,_2> matC;
  Matrix<float,_2,_2> invA;
  Matrix<float,_2,_2> blockA;
  Matrix<float,_2,_1> blockB;
  Matrix<float,_2,_2> zeroMat;
  float nullField [4];
  float areaC [2];
  float areaA [4];
  Matrix<float,_2,_1> local_f0;
  undefined1 local_e8 [16];
  Matrix<float,_2,_1> local_d8;
  Matrix<float,_1,_2> local_d0;
  Matrix<float,_2,_2> local_c8;
  float local_b8;
  float local_b4;
  float local_b0;
  Matrix<float,_2,_2> local_a8;
  Matrix<float,_2,_2> local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined4 local_78;
  Matrix<float,_2,_1> local_70;
  Matrix<float,_2,_2> local_68;
  float local_58 [4];
  undefined8 local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  local_38 = (mat->m_data).m_data[0].m_data[0];
  local_34 = (mat->m_data).m_data[1].m_data[0];
  local_30 = (mat->m_data).m_data[0].m_data[1];
  local_2c = (mat->m_data).m_data[1].m_data[1];
  local_48 = *(undefined8 *)(mat->m_data).m_data[2].m_data;
  local_40 = (mat->m_data).m_data[0].m_data[2];
  local_3c = (mat->m_data).m_data[1].m_data[2];
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  local_e8._0_4_ = (mat->m_data).m_data[2].m_data[2];
  tcu::Matrix<float,_2,_2>::Matrix(&local_98,&local_38);
  inverse<2>((MatrixCaseUtils *)&local_c8,&local_98);
  tcu::Matrix<float,_2,_1>::Matrix(&local_d8,(float *)&local_48);
  tcu::Matrix<float,_1,_2>::Matrix(&local_d0,&local_40);
  tcu::operator*((tcu *)&local_98,&local_d0,&local_c8);
  tcu::operator*((Matrix<float,_1,_2> *)&local_98,&local_d8);
  local_e8._0_4_ = (float)local_e8._0_4_ - local_68.m_data.m_data[0].m_data[0];
  tcu::Matrix<float,_2,_2>::Matrix(&local_68,local_58);
  tcu::operator*((tcu *)&local_70,&local_c8,&local_d8);
  scalar = 1.0 / (float)local_e8._0_4_;
  local_e8 = ZEXT416((uint)scalar);
  tcu::operator*((tcu *)&local_f0,&local_70,scalar);
  tcu::operator*((tcu *)&local_a8,&local_f0,&local_d0);
  tcu::operator*((tcu *)&local_98,&local_a8,&local_c8);
  tcu::operator+((tcu *)&local_b8,&local_c8,&local_98);
  tcu::operator-((tcu *)&local_98,&local_68,&local_c8);
  tcu::operator*((tcu *)&local_f0,&local_98,&local_d8);
  tcu::operator*((tcu *)&local_a8,&local_f0,(float)local_e8._0_4_);
  tcu::operator*((tcu *)&local_98,&local_d0,&local_c8);
  tcu::operator*((tcu *)&local_f0,(Matrix<float,_1,_2> *)&local_98,-(float)local_e8._0_4_);
  local_98.m_data.m_data[0].m_data[0] = local_b8;
  local_98.m_data.m_data[0].m_data[1] = local_b0;
  local_98.m_data.m_data[1].m_data[0] = local_a8.m_data.m_data[0].m_data[0];
  local_98.m_data.m_data[1].m_data[1] = local_b4;
  fStack_80 = local_f0.m_data.m_data[0].m_data[0];
  fStack_7c = local_f0.m_data.m_data[0].m_data[1];
  local_88 = local_b4;
  fStack_84 = local_a8.m_data.m_data[0].m_data[1];
  local_78 = local_e8._0_4_;
  tcu::Matrix<float,_3,_3>::Matrix(__return_storage_ptr__,(float *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<float, 3, 3> inverse<3> (const tcu::Matrix<float, 3, 3>& mat)
{
	// Blockwise inversion

	DE_ASSERT(determinant(mat) != 0.0f);

	const float areaA[2*2] =
	{
		mat(0,0),	mat(0,1),
		mat(1,0),	mat(1,1)
	};
	const float areaB[2] =
	{
		mat(0,2),
		mat(1,2),
	};
	const float areaC[2] =
	{
		mat(2,0),	mat(2,1),
	};
	const float areaD[1] =
	{
		mat(2,2)
	};
	const float nullField[4] = { 0.0f };

	const tcu::Matrix<float, 2, 2>	invA = inverse(tcu::Matrix<float, 2, 2>(areaA));
	const tcu::Matrix<float, 2, 1>	matB =         tcu::Matrix<float, 2, 1>(areaB);
	const tcu::Matrix<float, 1, 2>	matC =         tcu::Matrix<float, 1, 2>(areaC);
	const tcu::Matrix<float, 1, 1>	matD =         tcu::Matrix<float, 1, 1>(areaD);

	const float						schurComplement = 1.0f / (matD - matC*invA*matB)(0,0);
	const tcu::Matrix<float, 2, 2>	zeroMat         = Mat2(nullField);

	const tcu::Matrix<float, 2, 2>	blockA = invA + invA*matB*schurComplement*matC*invA;
	const tcu::Matrix<float, 2, 1>	blockB = (zeroMat-invA)*matB*schurComplement;
	const tcu::Matrix<float, 1, 2>	blockC = matC*invA*(-schurComplement);
	const float						blockD = schurComplement;

	const float result[3*3] =
	{
		blockA(0,0),	blockA(0,1),	blockB(0,0),
		blockA(1,0),	blockA(1,1),	blockB(1,0),
		blockC(0,0),	blockC(0,1),	blockD,
	};

	return Mat3(result);
}